

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O2

int main(void)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  long lVar7;
  uint local_44;
  char *t;
  char *f;
  
  local_44 = 0;
  uVar6 = 0;
  for (lVar7 = 0x10; lVar7 != 0x5f8; lVar7 = lVar7 + 0x18) {
    pcVar2 = *(char **)((long)&__frame_dummy_init_array_entry + lVar7);
    pcVar3 = *(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar7);
    uVar1 = *(uint *)((long)&fragment_tests[0].wildcard + lVar7);
    t = pcVar3;
    f = pcVar2;
    sVar5 = strlen(pcVar3);
    uVar4 = wc_match_fragment(&f,&t,pcVar3 + sVar5);
    if (uVar4 == uVar1) {
      local_44 = local_44 + 1;
    }
    else {
      printf("failed test: /%s/ against /%s/ returned %d not %d\n",pcVar2,pcVar3,(ulong)uVar4,
             (ulong)uVar1);
      uVar6 = uVar6 + 1;
    }
  }
  for (lVar7 = 0x10; lVar7 != 0x148; lVar7 = lVar7 + 0x18) {
    pcVar2 = *(char **)((long)&fragment_tests[0x3e].expected_result + lVar7);
    pcVar3 = *(char **)(&UNK_00104ca8 + lVar7);
    uVar1 = *(uint *)((long)&full_tests[0].wildcard + lVar7);
    uVar4 = wc_match(pcVar2,pcVar3);
    if (uVar4 == uVar1) {
      local_44 = local_44 + 1;
    }
    else {
      printf("failed test: /%s/ against /%s/ returned %d not %d\n",pcVar2,pcVar3,(ulong)uVar4,
             (ulong)uVar1);
      uVar6 = uVar6 + 1;
    }
  }
  printf("passed %d, failed %d\n",(ulong)local_44,(ulong)uVar6);
  return 0;
}

Assistant:

int main(void)
{
    int i;
    int fails, passes;

    fails = passes = 0;

    for (i = 0; i < sizeof(fragment_tests)/sizeof(*fragment_tests); i++) {
        const char *f, *t;
        int eret, aret;
        f = fragment_tests[i].wildcard;
        t = fragment_tests[i].target;
        eret = fragment_tests[i].expected_result;
        aret = wc_match_fragment(&f, &t, t + strlen(t));
        if (aret != eret) {
            printf("failed test: /%s/ against /%s/ returned %d not %d\n",
                   fragment_tests[i].wildcard, fragment_tests[i].target,
                   aret, eret);
            fails++;
        } else
            passes++;
    }

    for (i = 0; i < sizeof(full_tests)/sizeof(*full_tests); i++) {
        const char *f, *t;
        int eret, aret;
        f = full_tests[i].wildcard;
        t = full_tests[i].target;
        eret = full_tests[i].expected_result;
        aret = wc_match(f, t);
        if (aret != eret) {
            printf("failed test: /%s/ against /%s/ returned %d not %d\n",
                   full_tests[i].wildcard, full_tests[i].target,
                   aret, eret);
            fails++;
        } else
            passes++;
    }

    printf("passed %d, failed %d\n", passes, fails);

    return 0;
}